

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_psbt.cpp
# Opt level: O2

int CfdInitializeFundPsbt(void *handle,void **fund_handle)

{
  void *pvVar1;
  undefined8 *puVar2;
  CfdException *this;
  allocator local_49;
  undefined1 local_48 [32];
  
  cfd::Initialize();
  if (fund_handle != (void **)0x0) {
    std::__cxx11::string::string((string *)local_48,"PsbtFund",&local_49);
    pvVar1 = cfd::capi::AllocBuffer((string *)local_48,0x40);
    std::__cxx11::string::~string((string *)local_48);
    puVar2 = (undefined8 *)operator_new(0x18);
    *puVar2 = 0;
    puVar2[1] = 0;
    puVar2[2] = 0;
    *(undefined8 **)((long)pvVar1 + 0x10) = puVar2;
    puVar2 = (undefined8 *)operator_new(0x18);
    *puVar2 = 0;
    puVar2[1] = 0;
    puVar2[2] = 0;
    *(undefined8 **)((long)pvVar1 + 0x18) = puVar2;
    *(undefined8 *)((long)pvVar1 + 0x30) = 0x4034000000000000;
    *(undefined8 *)((long)pvVar1 + 0x20) = 0x4034000000000000;
    *(undefined8 *)((long)pvVar1 + 0x28) = 0x4008000000000000;
    *(undefined8 *)((long)pvVar1 + 0x38) = 0xffffffffffffffff;
    *fund_handle = pvVar1;
    return 0;
  }
  local_48._0_8_ = "cfdcapi_psbt.cpp";
  local_48._8_4_ = 0x980;
  local_48._16_8_ = "CfdInitializeFundPsbt";
  cfd::core::logger::warn<>((CfdSourceLocation *)local_48,"fund handle is null.");
  this = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)local_48,"Failed to parameter. fund handle is null.",&local_49);
  cfd::core::CfdException::CfdException(this,kCfdIllegalArgumentError,(string *)local_48);
  __cxa_throw(this,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdInitializeFundPsbt(void* handle, void** fund_handle) {
  int result = CfdErrorCode::kCfdUnknownError;
  CfdCapiPsbtFundHandle* buffer = nullptr;
  try {
    cfd::Initialize();
    if (fund_handle == nullptr) {
      warn(CFD_LOG_SOURCE, "fund handle is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. fund handle is null.");
    }

    buffer = static_cast<CfdCapiPsbtFundHandle*>(
        AllocBuffer(kPrefixPsbtFundHandle, sizeof(CfdCapiPsbtFundHandle)));
    buffer->utxos = new std::vector<UtxoData>();
    buffer->indexes = new std::vector<uint32_t>();
    buffer->fee_rate = 20.0;
    buffer->long_term_fee_rate = 20.0;
    buffer->dust_fee_rate = 3.0;
    buffer->knapsack_min_change = -1;
    *fund_handle = buffer;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  CfdFreeFundPsbt(handle, buffer);
  return result;
}